

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  ushort uVar1;
  Location __src;
  Location pCVar2;
  char cVar3;
  int iVar4;
  lconv *plVar5;
  long *plVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  _Alloc_hider _Var10;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  Char buffer [33];
  double value;
  string local_c8;
  ValueHolder local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ValueHolder local_58;
  undefined4 local_50;
  CommentInfo *local_48;
  ptrdiff_t pStack_40;
  ptrdiff_t local_38;
  
  local_a0.int_ = 0;
  __src = token->start_;
  pCVar2 = token->end_;
  __n = (long)pCVar2 - (long)__src;
  if ((long)__n < 0) {
    paVar11 = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Unable to parse token length","");
    addError(this,&local_c8,token,(Location)0x0);
    _Var10._M_p = local_c8._M_dataplus._M_p;
  }
  else {
    if ((long)__n < 0x21) {
      memcpy(&local_c8,__src,__n);
      *(undefined1 *)((long)&local_c8 + __n) = 0;
      plVar5 = localeconv();
      if (plVar5 == (lconv *)0x0) {
        cVar3 = '\0';
      }
      else {
        cVar3 = *plVar5->decimal_point;
      }
      if (((cVar3 != '\0') && (cVar3 != '.')) && (pCVar2 != __src)) {
        sVar7 = 0;
        do {
          if (*(char *)((long)&local_c8._M_dataplus._M_p + sVar7) == '.') {
            *(char *)((long)&local_c8._M_dataplus._M_p + sVar7) = cVar3;
          }
          sVar7 = sVar7 + 1;
        } while (__n != sVar7);
      }
      iVar4 = __isoc99_sscanf(&local_c8,&DAT_0011a99c,&local_a0);
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,__src,pCVar2);
      iVar4 = __isoc99_sscanf(local_c8._M_dataplus._M_p,&DAT_0011a99c,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
    }
    if (iVar4 == 1) {
      uVar1 = *(ushort *)&decoded->field_0x8;
      *(ushort *)&decoded->field_0x8 = uVar1 & 0xff00 | 3;
      local_58 = decoded->value_;
      decoded->value_ = local_a0;
      *(ushort *)&decoded->field_0x8 = uVar1 & 0xfe00 | 3;
      local_50 = CONCAT22((short)((uint)local_50 >> 0x10),
                          uVar1 & 0x100 | uVar1 & 0xff | (ushort)local_50 & 0xfe00);
      local_48 = decoded->comments_;
      decoded->comments_ = (CommentInfo *)0x0;
      pStack_40 = decoded->start_;
      decoded->start_ = 0;
      local_38 = decoded->limit_;
      decoded->limit_ = 0;
      Value::~Value((Value *)&local_58);
      return true;
    }
    paVar11 = &local_68;
    local_78[0] = paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,token->start_,token->end_);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x11a97d);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_88 = *plVar8;
      lStack_80 = plVar6[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar8;
      local_98 = (long *)*plVar6;
    }
    local_90 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_c8.field_2._M_allocated_capacity = *psVar9;
      local_c8.field_2._8_8_ = plVar6[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar9;
      local_c8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_c8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    addError(this,&local_c8,token,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    _Var10._M_p = (pointer)local_78[0];
    if (local_98 != &local_88) {
      operator_delete(local_98);
      _Var10._M_p = (pointer)local_78[0];
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != paVar11) {
    operator_delete(_Var10._M_p);
  }
  return false;
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  ptrdiff_t const length = token.end_ - token.start_;

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }
  size_t const ulength = static_cast<size_t>(length);

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, ulength);
    buffer[length] = 0;
    fixNumericLocaleInput(buffer, buffer + length);
    count = sscanf(buffer, format, &value);
  } else {
    JSONCPP_STRING buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError("'" + JSONCPP_STRING(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}